

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

TPZManVector<long,_62> * __thiscall
TPZManVector<long,_62>::operator=(TPZManVector<long,_62> *this,TPZManVector<long,_62> *copy)

{
  ulong uVar1;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  
  if (this != copy) {
    uVar1 = (copy->super_TPZVec<long>).fNElements;
    if (((this->super_TPZVec<long>).fNAlloc < (long)uVar1) &&
       (plVar3 = (this->super_TPZVec<long>).fStore,
       plVar3 != this->fExtAlloc && plVar3 != (long *)0x0)) {
      operator_delete__(plVar3);
      (this->super_TPZVec<long>).fStore = (long *)0x0;
      (this->super_TPZVec<long>).fNAlloc = 0;
    }
    if ((long)uVar1 < 0x3f) {
      plVar3 = (this->super_TPZVec<long>).fStore;
      if (plVar3 != (long *)0x0 && plVar3 != this->fExtAlloc) {
        operator_delete__(plVar3);
      }
      (this->super_TPZVec<long>).fNAlloc = 0;
      (this->super_TPZVec<long>).fStore = this->fExtAlloc;
    }
    else if ((this->super_TPZVec<long>).fNAlloc < (long)uVar1) {
      plVar3 = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
      (this->super_TPZVec<long>).fStore = plVar3;
      (this->super_TPZVec<long>).fNAlloc = uVar1;
    }
    (this->super_TPZVec<long>).fNElements = uVar1;
    if (0 < (long)uVar1) {
      plVar3 = (copy->super_TPZVec<long>).fStore;
      plVar2 = (this->super_TPZVec<long>).fStore;
      uVar4 = 0;
      do {
        plVar2[uVar4] = plVar3[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}